

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::Impl::makeDep
          (Impl *this,Binding *result,uint64_t typeId,Which whichType,Which expectedKind,
          Reader brand,StringPtr scopeName,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *brandBindings)

{
  size_t sVar1;
  RawSchema *schema;
  RawBrandedSchema *pRVar2;
  char *pcVar3;
  undefined6 in_register_00000082;
  StringPtr name;
  String local_68;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_48;
  
  if (typeId == 0x995f9a3377c0b16e) {
    schema = loadNative(this,(RawSchema *)schemas::s_995f9a3377c0b16e);
  }
  else {
    kj::str<char_const(&)[38],kj::StringPtr&,char_const(&)[2]>
              (&local_68,(kj *)"(unknown type; seen as dependency of ",(char (*) [38])&scopeName,
               (StringPtr *)0x211928,(char (*) [2])CONCAT62(in_register_00000082,expectedKind));
    pcVar3 = local_68.content.ptr;
    if (local_68.content.size_ == 0) {
      pcVar3 = "";
    }
    name.content.size_ = local_68.content.size_ + (local_68.content.size_ == 0);
    name.content.ptr = pcVar3;
    schema = loadEmpty(this,typeId,name,expectedKind,true);
    sVar1 = local_68.content.size_;
    pcVar3 = local_68.content.ptr;
    if (local_68.content.ptr != (char *)0x0) {
      local_68.content.ptr = (char *)0x0;
      local_68.content.size_ = 0;
      (**(local_68.content.disposer)->_vptr_ArrayDisposer)
                (local_68.content.disposer,pcVar3,1,sVar1,sVar1,0);
    }
  }
  result->which = (uint8_t)whichType;
  local_48.ptr.isSet = (brandBindings->ptr).isSet;
  if (local_48.ptr.isSet == true) {
    local_48.ptr.field_1.value.ptr = (brandBindings->ptr).field_1.value.ptr;
    local_48.ptr.field_1.value.size_ = (brandBindings->ptr).field_1.value.size_;
  }
  pRVar2 = makeBranded(this,schema,brand,&local_48);
  (result->field_4).schema = pRVar2;
  return;
}

Assistant:

void SchemaLoader::Impl::makeDep(_::RawBrandedSchema::Binding& result,
    uint64_t typeId, schema::Type::Which whichType, schema::Node::Which expectedKind,
    schema::Brand::Reader brand, kj::StringPtr scopeName,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> brandBindings) {
  const _::RawSchema* schema;
  if (typeId == capnp::typeId<StreamResult>()) {
    // StreamResult is a very special type that is used to mark when a method is declared as
    // streaming ("foo @0 () -> stream;"). We like to auto-load it if we see it as someone's
    // dependency.
    schema = loadNative(&_::rawSchema<StreamResult>());
  } else {
    schema = loadEmpty(typeId,
        kj::str("(unknown type; seen as dependency of ", scopeName, ")"),
        expectedKind, true);
  }
  result.which = static_cast<uint8_t>(whichType);
  result.schema = makeBranded(schema, brand, brandBindings);
}